

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setEnterBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  Status SVar1;
  Status *pSVar2;
  ulong *puVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  long in_RDI;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffcb0;
  double in_stack_fffffffffffffcb8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffcc0;
  undefined1 local_320 [128];
  ulong local_2a0;
  undefined1 local_298 [128];
  undefined1 local_218 [128];
  ulong local_198;
  undefined1 local_190 [144];
  undefined8 local_100;
  ulong *local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  ulong *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  cpp_dec_float<200U,_int,_void> *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  cpp_dec_float<200U,_int,_void> *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined8 local_20;
  ulong *local_18;
  undefined8 local_10;
  ulong *local_8;
  
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0x238));
  pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::Desc::rowStatus((Desc *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
  SVar1 = *pSVar2;
  if (SVar1 == P_FIXED) {
    puVar3 = (ulong *)infinity();
    local_2a0 = *puVar3 ^ 0x8000000000000000;
    local_c0 = local_298;
    local_c8 = &local_2a0;
    local_d0 = 0;
    local_18 = local_c8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    local_88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_90 = local_298;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffcb0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_b0 = infinity();
    local_a8 = local_320;
    local_b8 = 0;
    local_20 = local_b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    local_98 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_a0 = local_320;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffcb0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  else if (SVar1 == P_ON_LOWER) {
    puVar3 = (ulong *)infinity();
    local_198 = *puVar3 ^ 0x8000000000000000;
    local_f0 = local_190;
    local_f8 = &local_198;
    local_100 = 0;
    local_8 = local_f8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    local_68 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_70 = local_190;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffcb0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_30 = pnVar5;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffcb0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  else if (SVar1 == P_ON_UPPER) {
    pcVar4 = &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac)->m_backend;
    local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_40 = pcVar4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffcb0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_e0 = infinity();
    local_d8 = local_218;
    local_e8 = 0;
    local_10 = local_e0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (pcVar4,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    local_78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    local_80 = local_218;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffcb0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  else {
    pcVar4 = &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac)->m_backend;
    local_48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)pcVar4,in_stack_fffffffffffffcac);
    local_50 = pcVar4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (pcVar4,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)pcVar4,in_stack_fffffffffffffcac);
    local_58 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)pcVar4,in_stack_fffffffffffffcac);
    local_60 = pnVar5;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (pcVar4,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}